

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O3

void __thiscall
rpn::RPNExpression::Push<rpn::StringExpression,std::__cxx11::string>
          (RPNExpression *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer *__ptr;
  size_type *psVar3;
  __uniq_ptr_impl<rpn::IExpression,_std::default_delete<rpn::IExpression>_> local_38 [3];
  size_type local_20;
  long lStack_18;
  
  local_38[0]._M_t.
  super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
  super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl =
       (tuple<rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>)operator_new(0x28);
  psVar3 = (size_type *)(args->_M_dataplus)._M_p;
  paVar1 = &args->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3 == paVar1) {
    local_20 = paVar1->_M_allocated_capacity;
    lStack_18 = *(long *)((long)&args->field_2 + 8);
    psVar3 = &local_20;
  }
  else {
    local_20 = paVar1->_M_allocated_capacity;
  }
  sVar2 = args->_M_string_length;
  (args->_M_dataplus)._M_p = (pointer)paVar1;
  args->_M_string_length = 0;
  (args->field_2)._M_local_buf[0] = '\0';
  *(undefined ***)
   local_38[0]._M_t.
   super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
   super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl = &PTR__StringExpression_00112ae0;
  *(size_type **)
   ((long)local_38[0]._M_t.
          super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
          super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 8) =
       (size_type *)
       ((long)local_38[0]._M_t.
              super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
              super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 0x18);
  if (psVar3 == &local_20) {
    *(size_type *)
     ((long)local_38[0]._M_t.
            super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
            super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 0x18) = local_20;
    *(long *)((long)local_38[0]._M_t.
                    super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>
                    .super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 0x20) =
         lStack_18;
  }
  else {
    *(size_type **)
     ((long)local_38[0]._M_t.
            super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
            super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 8) = psVar3;
    *(size_type *)
     ((long)local_38[0]._M_t.
            super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
            super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 0x18) = local_20;
  }
  *(size_type *)
   ((long)local_38[0]._M_t.
          super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
          super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 0x10) = sVar2;
  std::
  vector<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>,std::allocator<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>>
  ::emplace_back<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>
            ((vector<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>,std::allocator<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>>
              *)this,(unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_> *)
                     local_38);
  if ((_Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>)
      local_38[0]._M_t.
      super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
      super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl != (IExpression *)0x0) {
    (**(code **)(*(long *)local_38[0]._M_t.
                          super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>
                          .super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void Push(ExprArgs&&... args)
    {
        Push(std::make_unique<ExprT>(std::forward<ExprArgs>(args)...));
    }